

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

size_t gz_write(gz_state *state,void *buf,size_t len)

{
  int iVar1;
  uint uVar2;
  gz_state *len_00;
  gz_state *in_RDX;
  gz_state *in_RSI;
  long in_RDI;
  uint n;
  uint copy;
  uint have;
  size_t put;
  uint local_34;
  uint local_30;
  gz_state *in_stack_fffffffffffffff8;
  
  if (in_RDX == (gz_state *)0x0) {
    in_RDX = (gz_state *)0x0;
  }
  else {
    len_00 = in_RDX;
    if ((*(int *)(in_RDI + 0x28) == 0) && (iVar1 = gz_init(in_RDX), iVar1 == -1)) {
      in_RDX = (gz_state *)0x0;
    }
    else {
      if (*(int *)(in_RDI + 0x70) != 0) {
        *(undefined4 *)(in_RDI + 0x70) = 0;
        iVar1 = gz_zero(in_RSI,(off64_t)len_00);
        if (iVar1 == -1) {
          return 0;
        }
      }
      if (len_00 < (gz_state *)(ulong)*(uint *)(in_RDI + 0x28)) {
        do {
          if (*(int *)(in_RDI + 0x88) == 0) {
            *(undefined8 *)(in_RDI + 0x80) = *(undefined8 *)(in_RDI + 0x30);
          }
          uVar2 = ((int)*(undefined8 *)(in_RDI + 0x80) + *(int *)(in_RDI + 0x88)) -
                  (int)*(undefined8 *)(in_RDI + 0x30);
          local_30 = *(int *)(in_RDI + 0x28) - uVar2;
          if (len_00 < (gz_state *)(ulong)local_30) {
            local_30 = (uint)len_00;
          }
          memcpy((void *)(*(long *)(in_RDI + 0x30) + (ulong)uVar2),in_RSI,(ulong)local_30);
          *(uint *)(in_RDI + 0x88) = local_30 + *(int *)(in_RDI + 0x88);
          *(ulong *)(in_RDI + 0x10) = (ulong)local_30 + *(long *)(in_RDI + 0x10);
          in_RSI = (gz_state *)((long)&(in_RSI->x).have + (ulong)local_30);
          len_00 = (gz_state *)((long)len_00 - (ulong)local_30);
          if ((len_00 != (gz_state *)0x0) &&
             (iVar1 = gz_comp(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20)), iVar1 == -1))
          {
            return 0;
          }
        } while (len_00 != (gz_state *)0x0);
      }
      else if ((*(int *)(in_RDI + 0x88) == 0) ||
              (iVar1 = gz_comp(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20)), iVar1 != -1)
              ) {
        *(gz_state **)(in_RDI + 0x80) = in_RSI;
        do {
          local_34 = 0xffffffff;
          if (len_00 < (gz_state *)0xffffffff) {
            local_34 = (uint)len_00;
          }
          *(uint *)(in_RDI + 0x88) = local_34;
          *(ulong *)(in_RDI + 0x10) = (ulong)local_34 + *(long *)(in_RDI + 0x10);
          iVar1 = gz_comp(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
          if (iVar1 == -1) {
            return 0;
          }
          len_00 = (gz_state *)((long)len_00 - (ulong)local_34);
        } while (len_00 != (gz_state *)0x0);
      }
      else {
        in_RDX = (gz_state *)0x0;
      }
    }
  }
  return (size_t)in_RDX;
}

Assistant:

static size_t gz_write(gz_state *state, void const *buf, size_t len) {
    size_t put = len;

    /* if len is zero, avoid unnecessary operations */
    if (len == 0)
        return 0;

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return 0;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return 0;
    }

    /* for small len, copy to input buffer, otherwise compress directly */
    if (len < state->size) {
        /* copy to input buffer, compress when full */
        do {
            unsigned have, copy;

            if (state->strm.avail_in == 0)
                state->strm.next_in = state->in;
            have = (unsigned)((state->strm.next_in + state->strm.avail_in) -
                              state->in);
            copy = state->size - have;
            if (copy > len)
                copy = (unsigned)len;
            memcpy(state->in + have, buf, copy);
            state->strm.avail_in += copy;
            state->x.pos += copy;
            buf = (const char *)buf + copy;
            len -= copy;
            if (len && gz_comp(state, Z_NO_FLUSH) == -1)
                return 0;
        } while (len);
    } else {
        /* consume whatever's left in the input buffer */
        if (state->strm.avail_in && gz_comp(state, Z_NO_FLUSH) == -1)
            return 0;

        /* directly compress user buffer to file */
        state->strm.next_in = (z_const unsigned char *) buf;
        do {
            unsigned n = (unsigned)-1;
            if (n > len)
                n = (unsigned)len;
            state->strm.avail_in = n;
            state->x.pos += n;
            if (gz_comp(state, Z_NO_FLUSH) == -1)
                return 0;
            len -= n;
        } while (len);
    }

    /* input was all buffered or compressed */
    return put;
}